

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f *uv,Float time,Vector3f *wo)

{
  float fVar1;
  undefined4 uVar3;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Tuple2<pbrt::Point2,_float> TVar12;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ulong uVar13;
  bool bVar20;
  int *piVar21;
  Point3f *pPVar22;
  Point2f *pPVar23;
  Normal3f *pNVar24;
  float fVar25;
  ulong uVar26;
  undefined8 uVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  Float sinTheta;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  Vector3f local_2c8;
  Vector3f local_2b8;
  float local_2ac;
  Normal3f local_2a8;
  Tuple3<pbrt::Vector3,_float> local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  float local_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  float va;
  float fStack_1f4;
  float local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  Point2f uvTex;
  Tuple3<pbrt::Normal3,_float> local_120;
  Tuple3<pbrt::Normal3,_float> local_110;
  Tuple3<pbrt::Vector3,_float> local_100;
  Tuple3<pbrt::Normal3,_float> local_f0;
  Tuple3<pbrt::Point3,_float> local_e0;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  double vb;
  float local_a8;
  float local_a0;
  float local_9c;
  Float local_98;
  Float local_90;
  float local_8c;
  Float local_88;
  float fVar2;
  undefined1 auVar37 [16];
  
  uStack_200 = local_208;
  local_208 = (undefined1  [8])wo;
  local_288._0_4_ = time;
  piVar21 = mesh->vertexIndices;
  pPVar22 = mesh->p;
  lVar30 = (long)(patchIndex * 4);
  fVar51 = pPVar22[piVar21[lVar30]].super_Tuple3<pbrt::Point3,_float>.z;
  auVar99._4_4_ = fVar51;
  auVar99._0_4_ = fVar51;
  auVar99._8_4_ = fVar51;
  auVar99._12_4_ = fVar51;
  fVar67 = pPVar22[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  fVar50 = pPVar22[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  uVar13._0_4_ = pPVar22[piVar21[lVar30]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar13._4_4_ = pPVar22[piVar21[lVar30]].super_Tuple3<pbrt::Point3,_float>.y;
  uVar9._0_4_ = pPVar22[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar9._4_4_ = pPVar22[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar9;
  uVar10._0_4_ = pPVar22[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar10._4_4_ = pPVar22[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar10;
  uVar11._0_4_ = pPVar22[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar11._4_4_ = pPVar22[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar11;
  auVar32 = vbroadcastss_avx512vl
                      (ZEXT416((uint)pPVar22[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Point3,_float>.
                                     z));
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  TVar12 = uv->super_Tuple2<pbrt::Point2,_float>;
  auVar34._8_8_ = 0;
  auVar34._0_4_ = TVar12.x;
  auVar34._4_4_ = TVar12.y;
  auVar37 = vsubps_avx(auVar44,auVar34);
  fVar49 = auVar37._0_4_;
  auVar43 = vinsertps_avx512f(ZEXT416((uint)fVar67),ZEXT416((uint)fVar50),0x10);
  fVar25 = TVar12.x;
  auVar35._0_4_ = auVar43._0_4_ * fVar25 + fVar51 * fVar49;
  auVar35._4_4_ = auVar43._4_4_ * TVar12.y + fVar51 * auVar37._4_4_;
  auVar35._8_4_ = auVar43._8_4_ * 0.0 + fVar51 * auVar37._8_4_;
  auVar35._12_4_ = auVar43._12_4_ * 0.0 + fVar51 * auVar37._12_4_;
  auVar43 = vinsertps_avx512f(ZEXT416((uint)fVar50),ZEXT416((uint)fVar67),0x10);
  auVar33 = vmulps_avx512vl(auVar32,auVar34);
  auVar36._0_4_ = auVar33._0_4_ + auVar43._0_4_ * fVar49;
  auVar36._4_4_ = auVar33._4_4_ + auVar43._4_4_ * auVar37._4_4_;
  auVar36._8_4_ = auVar33._8_4_ + auVar43._8_4_ * auVar37._8_4_;
  auVar36._12_4_ = auVar33._12_4_ + auVar43._12_4_ * auVar37._12_4_;
  auVar37 = vmovshdup_avx(auVar37);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar13;
  auVar33 = vmulps_avx512vl(auVar104,auVar37);
  auVar43 = vmovshdup_avx(auVar34);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar10;
  auVar34 = vmulps_avx512vl(auVar100,auVar43);
  auVar41._0_4_ = auVar34._0_4_ + auVar33._0_4_;
  auVar41._4_4_ = auVar34._4_4_ + auVar33._4_4_;
  auVar41._8_4_ = auVar34._8_4_ + auVar33._8_4_;
  auVar41._12_4_ = auVar34._12_4_ + auVar33._12_4_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar9;
  auVar33 = vmulps_avx512vl(auVar103,auVar37);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar11;
  auVar34 = vmulps_avx512vl(auVar101,auVar43);
  auVar45._0_4_ = auVar34._0_4_ + auVar33._0_4_;
  auVar45._4_4_ = auVar34._4_4_ + auVar33._4_4_;
  auVar45._8_4_ = auVar34._8_4_ + auVar33._8_4_;
  auVar45._12_4_ = auVar34._12_4_ + auVar33._12_4_;
  auVar40._4_4_ = fVar49;
  auVar40._0_4_ = fVar49;
  auVar40._8_4_ = fVar49;
  auVar40._12_4_ = fVar49;
  auVar86._4_4_ = fVar25;
  auVar86._0_4_ = fVar25;
  auVar86._8_4_ = fVar25;
  auVar86._12_4_ = fVar25;
  auVar75._0_4_ = fVar49 * auVar41._0_4_ + fVar25 * auVar45._0_4_;
  auVar75._4_4_ = fVar49 * auVar41._4_4_ + fVar25 * auVar45._4_4_;
  auVar75._8_4_ = fVar49 * auVar41._8_4_ + fVar25 * auVar45._8_4_;
  auVar75._12_4_ = fVar49 * auVar41._12_4_ + fVar25 * auVar45._12_4_;
  auVar33 = vmovshdup_avx(auVar35);
  auVar34 = vmovshdup_avx(auVar36);
  local_e0.z = auVar34._0_4_ * fVar25 + auVar33._0_4_ * fVar49;
  local_e0._0_8_ = vmovlps_avx(auVar75);
  auVar33 = vsubps_avx(auVar45,auVar41);
  local_2b8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar33);
  auVar34 = vsubps_avx(auVar36,auVar35);
  auVar33 = vmovshdup_avx(auVar34);
  local_2b8.super_Tuple3<pbrt::Vector3,_float>.z = auVar33._0_4_;
  auVar35 = vmulps_avx512vl(auVar100,auVar40);
  auVar36 = vmulps_avx512vl(auVar101,auVar86);
  auVar39._0_4_ = auVar36._0_4_ + auVar35._0_4_;
  auVar39._4_4_ = auVar36._4_4_ + auVar35._4_4_;
  auVar39._8_4_ = auVar36._8_4_ + auVar35._8_4_;
  auVar39._12_4_ = auVar36._12_4_ + auVar35._12_4_;
  auVar35 = vmulps_avx512vl(auVar104,auVar40);
  auVar36 = vmulps_avx512vl(auVar103,auVar86);
  auVar42._0_4_ = auVar36._0_4_ + auVar35._0_4_;
  auVar42._4_4_ = auVar36._4_4_ + auVar35._4_4_;
  auVar42._8_4_ = auVar36._8_4_ + auVar35._8_4_;
  auVar42._12_4_ = auVar36._12_4_ + auVar35._12_4_;
  auVar35 = vsubps_avx(auVar39,auVar42);
  local_2c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar35);
  local_2c8.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
  uvTex = *(Point2f *)&uv->super_Tuple2<pbrt::Point2,_float>;
  pPVar23 = mesh->uv;
  auVar35 = ZEXT416((uint)fVar50);
  auVar36 = ZEXT416((uint)fVar67);
  if (pPVar23 != (Point2f *)0x0) {
    fVar51 = (uv->super_Tuple2<pbrt::Point2,_float>).x;
    auVar87._4_4_ = fVar51;
    auVar87._0_4_ = fVar51;
    auVar87._8_4_ = fVar51;
    auVar87._12_4_ = fVar51;
    fVar49 = 1.0 - fVar51;
    auVar68._0_4_ =
         (pPVar23[piVar21[lVar30]].super_Tuple2<pbrt::Point2,_float>.x * auVar37._0_4_ +
         pPVar23[piVar21[lVar30 + 2]].super_Tuple2<pbrt::Point2,_float>.x * auVar43._0_4_) * fVar49
         + fVar51 * (pPVar23[piVar21[lVar30 + 3]].super_Tuple2<pbrt::Point2,_float>.x *
                     auVar43._0_4_ +
                    pPVar23[piVar21[lVar30 + 1]].super_Tuple2<pbrt::Point2,_float>.x * auVar37._0_4_
                    );
    auVar68._4_4_ =
         (pPVar23[piVar21[lVar30]].super_Tuple2<pbrt::Point2,_float>.y * auVar37._4_4_ +
         pPVar23[piVar21[lVar30 + 2]].super_Tuple2<pbrt::Point2,_float>.y * auVar43._4_4_) * fVar49
         + fVar51 * (pPVar23[piVar21[lVar30 + 3]].super_Tuple2<pbrt::Point2,_float>.y *
                     auVar43._4_4_ +
                    pPVar23[piVar21[lVar30 + 1]].super_Tuple2<pbrt::Point2,_float>.y * auVar37._4_4_
                    );
    auVar68._8_4_ =
         (auVar37._8_4_ * 0.0 + auVar43._8_4_ * 0.0) * fVar49 +
         fVar51 * (auVar43._8_4_ * 0.0 + auVar37._8_4_ * 0.0);
    auVar68._12_4_ =
         (auVar37._12_4_ * 0.0 + auVar43._12_4_ * 0.0) * fVar49 +
         fVar51 * (auVar43._12_4_ * 0.0 + auVar37._12_4_ * 0.0);
    uvTex.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar68);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_2b8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_2c8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar90._8_8_ = 0;
    auVar90._0_4_ = pPVar23[piVar21[lVar30]].super_Tuple2<pbrt::Point2,_float>.x;
    auVar90._4_4_ = pPVar23[piVar21[lVar30]].super_Tuple2<pbrt::Point2,_float>.y;
    auVar93._8_8_ = 0;
    auVar93._0_4_ = pPVar23[piVar21[lVar30 + 1]].super_Tuple2<pbrt::Point2,_float>.x;
    auVar93._4_4_ = pPVar23[piVar21[lVar30 + 1]].super_Tuple2<pbrt::Point2,_float>.y;
    auVar95._8_8_ = 0;
    auVar95._0_4_ = pPVar23[piVar21[lVar30 + 2]].super_Tuple2<pbrt::Point2,_float>.x;
    auVar95._4_4_ = pPVar23[piVar21[lVar30 + 2]].super_Tuple2<pbrt::Point2,_float>.y;
    auVar37 = vinsertps_avx(auVar95,auVar93,0x50);
    auVar37 = vsubps_avx(auVar37,auVar90);
    auVar39 = vsubps_avx(auVar90,auVar95);
    auVar39 = vsubps_avx(auVar39,auVar93);
    auVar96._0_4_ = pPVar23[piVar21[lVar30 + 3]].super_Tuple2<pbrt::Point2,_float>.x + auVar39._0_4_
    ;
    auVar96._4_4_ = pPVar23[piVar21[lVar30 + 3]].super_Tuple2<pbrt::Point2,_float>.y + auVar39._4_4_
    ;
    auVar96._8_4_ = auVar39._8_4_ + 0.0;
    auVar96._12_4_ = auVar39._12_4_ + 0.0;
    auVar84._4_4_ = TVar12.y;
    auVar84._0_4_ = fVar51;
    auVar84._8_8_ = 0;
    auVar41 = vfmadd213ps_fma(auVar84,auVar96,auVar37);
    auVar37 = vinsertps_avx(auVar93,auVar95,0x50);
    auVar39 = vsubps_avx(auVar37,auVar90);
    auVar37 = vblendps_avx(auVar43,auVar87,2);
    auVar43 = vfmadd213ps_fma(auVar37,auVar96,auVar39);
    auVar88._8_4_ = 0x322bcc77;
    auVar88._0_8_ = 0x322bcc77322bcc77;
    auVar88._12_4_ = 0x322bcc77;
    auVar91._8_4_ = 0x7fffffff;
    auVar91._0_8_ = 0x7fffffff7fffffff;
    auVar91._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx(auVar91,auVar41);
    uVar26 = vcmpps_avx512vl(auVar37,auVar88,5);
    auVar37 = vdivps_avx512vl(auVar44,auVar41);
    fVar49 = (float)((uint)((byte)uVar26 & 1) * auVar37._0_4_);
    fVar51 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar37._4_4_);
    auVar38._4_4_ = fVar51;
    auVar38._0_4_ = fVar49;
    fVar25 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar37._8_4_);
    auVar38._8_4_ = fVar25;
    fVar73 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar37._12_4_);
    auVar38._12_4_ = fVar73;
    auVar37 = vandps_avx(auVar91,auVar43);
    uVar26 = vcmpps_avx512vl(auVar37,auVar88,5);
    auVar37 = vdivps_avx512vl(auVar44,auVar43);
    fVar48 = (float)((uint)((byte)uVar26 & 1) * auVar37._0_4_);
    fVar78 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar37._4_4_);
    auVar43._4_4_ = fVar78;
    auVar43._0_4_ = fVar48;
    fVar1 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar37._8_4_);
    auVar43._8_4_ = fVar1;
    fVar2 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar37._12_4_);
    auVar43._12_4_ = fVar2;
    auVar37 = vshufps_avx(auVar34,auVar34,0xe1);
    auVar97._0_4_ = local_2c8.super_Tuple3<pbrt::Vector3,_float>.z * fVar49 + auVar37._0_4_ * fVar48
    ;
    auVar97._4_4_ = auVar34._4_4_ * fVar51 + auVar37._4_4_ * fVar78;
    auVar97._8_4_ = auVar34._8_4_ * fVar25 + auVar37._8_4_ * fVar1;
    auVar97._12_4_ = auVar34._12_4_ * fVar73 + auVar37._12_4_ * fVar2;
    fVar73 = (float)local_2b8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    fVar78 = (float)((ulong)local_2b8.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    fVar25 = (float)local_2c8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    fVar51 = (float)((ulong)local_2c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    auVar98._0_4_ = fVar73 * fVar48 + fVar49 * fVar25;
    auVar98._4_4_ = fVar78 * fVar48 + fVar49 * fVar51;
    auVar98._8_4_ = fVar48 * 0.0 + fVar49 * 0.0;
    auVar98._12_4_ = fVar48 * 0.0 + fVar49 * 0.0;
    auVar39 = vmovshdup_avx512vl(auVar98);
    auVar37 = vmovshdup_avx(auVar38);
    auVar85._0_4_ = fVar73 * auVar37._0_4_;
    auVar85._4_4_ = fVar78 * auVar37._4_4_;
    auVar85._8_4_ = auVar37._8_4_ * 0.0;
    auVar85._12_4_ = auVar37._12_4_ * 0.0;
    auVar37 = vmovshdup_avx(auVar43);
    auVar79._0_4_ = fVar25 * auVar37._0_4_;
    auVar79._4_4_ = fVar51 * auVar37._4_4_;
    auVar79._8_4_ = auVar37._8_4_ * 0.0;
    auVar79._12_4_ = auVar37._12_4_ * 0.0;
    auVar40 = vaddps_avx512vl(auVar85,auVar79);
    auVar41 = vmovshdup_avx512vl(auVar40);
    auVar42 = vmovshdup_avx512vl(auVar97);
    auVar37 = ZEXT416((uint)(auVar97._0_4_ * auVar41._0_4_));
    auVar43 = vfmsub213ss_avx512f(auVar42,auVar39,auVar37);
    auVar92._8_4_ = 0x80000000;
    auVar92._0_8_ = 0x8000000080000000;
    auVar92._12_4_ = 0x80000000;
    auVar37 = vfnmadd231ss_fma(auVar37,auVar97,auVar41);
    fVar51 = auVar43._0_4_ + auVar37._0_4_;
    auVar37 = vmulss_avx512f(auVar98,auVar42);
    auVar89._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
    auVar89._8_4_ = auVar37._8_4_ ^ 0x80000000;
    auVar89._12_4_ = auVar37._12_4_ ^ 0x80000000;
    auVar44 = vxorps_avx512vl(auVar98,auVar92);
    auVar43 = vinsertps_avx512f(auVar40,auVar44,0x10);
    auVar37 = vinsertps_avx(auVar89,auVar37,0x1c);
    auVar37 = vfmadd231ps_fma(auVar37,auVar97,auVar43);
    auVar37 = vhaddps_avx(auVar37,auVar37);
    auVar45 = vmulss_avx512f(auVar39,auVar40);
    auVar43 = vfmsub213ss_fma(auVar41,auVar98,auVar45);
    auVar41 = vfnmadd231ss_avx512f(auVar45,auVar39,auVar40);
    fVar49 = auVar43._0_4_ + auVar41._0_4_;
    fVar48 = auVar37._0_4_;
    if ((((fVar49 != 0.0) || (NAN(fVar49))) || (fVar51 != 0.0)) ||
       (((NAN(fVar51) || (fVar48 != 0.0)) || (NAN(fVar48))))) {
      auVar46 = vxorps_avx512vl(auVar97,auVar92);
      auVar36 = vxorps_avx512vl(auVar39,auVar92);
      auVar37 = vmovshdup_avx(auVar69);
      auVar43 = vmovshdup_avx(auVar74);
      auVar94 = ZEXT416((uint)(auVar37._0_4_ * local_2b8.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar35 = vfmsub213ss_fma(auVar34,auVar43,auVar94);
      auVar94 = vfnmadd231ss_fma(auVar94,auVar33,auVar37);
      fVar78 = auVar35._0_4_ + auVar94._0_4_;
      auVar33 = vfmsub213ss_fma(auVar33,auVar69,
                                ZEXT416((uint)(local_2c8.super_Tuple3<pbrt::Vector3,_float>.z *
                                              fVar73)));
      auVar34 = vfnmadd231ss_fma(ZEXT416((uint)(local_2c8.super_Tuple3<pbrt::Vector3,_float>.z *
                                               fVar73)),auVar74,auVar34);
      fVar73 = auVar34._0_4_ + auVar33._0_4_;
      auVar33 = ZEXT416((uint)(auVar43._0_4_ * fVar25));
      auVar37 = vfmsub213ss_fma(auVar37,auVar74,auVar33);
      auVar43 = vfnmadd213ss_fma(auVar69,auVar43,auVar33);
      fVar25 = auVar37._0_4_ + auVar43._0_4_;
      auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar51),ZEXT416((uint)fVar78),
                                ZEXT416((uint)(fVar73 * fVar48)));
      auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar49),ZEXT416((uint)fVar25),auVar37);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar43 = vxorps_avx512vl(auVar42,auVar33);
      if (auVar37._0_4_ < 0.0) {
        auVar40 = vxorps_avx512vl(auVar40,auVar33);
      }
      uVar27 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x20,1);
      bVar28 = (bool)((byte)uVar27 & 1);
      auVar47._4_12_ = auVar42._4_12_;
      auVar47._0_4_ = (float)((uint)bVar28 * auVar43._0_4_ + (uint)!bVar28 * auVar42._0_4_);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar73 * fVar73)),ZEXT416((uint)fVar78),
                                ZEXT416((uint)fVar78));
      auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      _local_228 = ZEXT416((uint)fVar67);
      _fStack_240 = 0;
      local_248 = (undefined1  [8])uVar10;
      _fStack_250 = 0;
      local_258 = (undefined1  [8])uVar11;
      local_268 = ZEXT416((uint)fVar50);
      local_278._8_8_ = 0;
      local_278._0_8_ = uVar9;
      local_238 = auVar99;
      if (auVar37._0_4_ < 0.0) {
        local_2ac = fVar73;
        local_20c = fVar25;
        local_1e8 = auVar46;
        local_1d8 = auVar36;
        local_1c8 = auVar44;
        local_1b8 = auVar39;
        fVar51 = sqrtf(auVar37._0_4_);
        fVar25 = local_20c;
        fVar73 = local_2ac;
        auVar39 = local_1b8;
        auVar44 = local_1c8;
        auVar36 = local_1d8;
        auVar46 = local_1e8;
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        fVar51 = auVar37._0_4_;
      }
      auVar43 = vmovshdup_avx512vl(auVar40);
      auVar33 = ZEXT416((uint)(auVar97._0_4_ * auVar43._0_4_));
      auVar37 = vfmsub213ss_avx512f(auVar47,auVar39,auVar33);
      auVar33 = vfmadd213ss_avx512f(auVar46,auVar43,auVar33);
      auVar33 = vaddss_avx512f(auVar37,auVar33);
      auVar34 = vmulss_avx512f(auVar98,auVar47);
      auVar37 = vfmsub213ss_fma(auVar40,auVar97,auVar34);
      auVar34 = vfmadd213ss_avx512f(auVar44,auVar47,auVar34);
      auVar37 = vaddss_avx512f(auVar37,auVar34);
      fVar67 = auVar37._0_4_;
      auVar34 = vmulss_avx512f(auVar39,auVar40);
      auVar37 = vfmsub213ss_fma(auVar43,auVar98,auVar34);
      auVar43 = vfmadd213ss_avx512f(auVar36,auVar40,auVar34);
      auVar43 = vaddss_avx512f(auVar37,auVar43);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar67)),auVar33,auVar33);
      auVar37 = vfmadd231ss_fma(auVar37,auVar43,auVar43);
      if (auVar37._0_4_ < 0.0) {
        local_1b8._0_4_ = fVar25 / fVar51;
        local_1c8._0_4_ = fVar78 / fVar51;
        local_1d8._0_4_ = fVar73 / fVar51;
        local_1e8._0_4_ = auVar33._0_4_;
        local_2ac = auVar43._0_4_;
        fVar48 = sqrtf(auVar37._0_4_);
        auVar43 = ZEXT416((uint)local_2ac);
        auVar33 = ZEXT416((uint)local_1e8._0_4_);
        fVar49 = (float)local_1d8._0_4_;
        fVar50 = (float)local_1b8._0_4_;
        fVar51 = (float)local_1c8._0_4_;
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        fVar48 = auVar37._0_4_;
        fVar49 = fVar73 / fVar51;
        fVar50 = fVar25 / fVar51;
        fVar51 = fVar78 / fVar51;
      }
      auVar37._0_4_ = auVar33._0_4_ / fVar48;
      auVar37._4_12_ = auVar33._4_12_;
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * (fVar67 / fVar48))),ZEXT416((uint)fVar51),
                                auVar37);
      auVar52._0_4_ = auVar43._0_4_ / fVar48;
      auVar52._4_12_ = auVar43._4_12_;
      auVar37 = vfmadd213ss_fma(auVar52,ZEXT416((uint)fVar50),auVar37);
      va = auVar37._0_4_;
      vb = -0.001;
      if (auVar37._0_4_ < -0.001) {
        LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.h"
                   ,0x584,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                   (char (*) [6])"-1e-3",
                   (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                   &va,(char (*) [6])"-1e-3",&vb);
      }
      local_2b8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar98);
      local_2c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx512f(auVar40);
      auVar46 = _local_248;
      auVar94 = local_278;
      auVar102 = _local_258;
      auVar35 = local_268;
      auVar36 = _local_228;
      auVar99 = local_238;
      local_2c8.super_Tuple3<pbrt::Vector3,_float>.z = auVar47._0_4_;
      local_2b8.super_Tuple3<pbrt::Vector3,_float>.z = auVar97._0_4_;
    }
  }
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar13;
  auVar37 = vsubps_avx512vl(auVar105,auVar46);
  auVar37 = vsubps_avx512vl(auVar37,auVar94);
  auVar41 = vaddps_avx512vl(auVar37,auVar102);
  auVar37 = vmovshdup_avx(auVar41);
  auVar43 = vsubss_avx512f(auVar99,auVar35);
  auVar42 = vaddss_avx512f(ZEXT416((uint)(auVar43._0_4_ - auVar36._0_4_)),auVar32);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_2b8.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z));
  auVar45 = ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)),auVar45,
                            ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar40 = ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z);
  auVar33 = vfmadd231ss_fma(auVar33,auVar40,
                            ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.z));
  auVar75 = ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(local_2c8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x),auVar75);
  auVar86 = ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.z);
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.z),
                            auVar86);
  auVar39 = vfmsub213ss_fma(auVar86,ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.y),
                            ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.z *
                                          local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)));
  auVar44 = vfnmadd231ss_fma(ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.z *
                                           local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)),auVar40,
                             ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.y));
  fVar51 = auVar39._0_4_ + auVar44._0_4_;
  auVar39 = vfmsub213ss_fma(auVar40,auVar75,
                            ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.x *
                                          local_2c8.super_Tuple3<pbrt::Vector3,_float>.z)));
  auVar44 = vfnmadd213ss_fma(auVar86,auVar45,
                             ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.x *
                                           local_2c8.super_Tuple3<pbrt::Vector3,_float>.z)));
  fVar67 = auVar39._0_4_ + auVar44._0_4_;
  auVar39 = vfmsub213ss_fma(ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.y),auVar45,
                            ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_2c8.super_Tuple3<pbrt::Vector3,_float>.x)));
  auVar44 = vfnmadd213ss_fma(auVar75,ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.y),
                             ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                           local_2c8.super_Tuple3<pbrt::Vector3,_float>.x)));
  fVar50 = auVar39._0_4_ + auVar44._0_4_;
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar67)),ZEXT416((uint)fVar51),
                            ZEXT416((uint)fVar51));
  auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
  auVar44 = ZEXT816(0) << 0x20;
  if (auVar39._0_4_ < 0.0) {
    local_1d8._0_4_ = fVar51;
    local_1e8._0_4_ = fVar67;
    local_278 = auVar94;
    local_268 = auVar35;
    _local_258 = auVar102;
    _local_248 = auVar46;
    local_238 = auVar99;
    _local_228 = auVar36;
    local_1c8 = auVar37;
    local_1b8 = auVar41;
    fVar49 = sqrtf(auVar39._0_4_);
    auVar44 = ZEXT816(0) << 0x40;
    auVar34 = ZEXT416(auVar34._0_4_);
    auVar33 = ZEXT416(auVar33._0_4_);
    auVar43 = ZEXT416(auVar43._0_4_);
    auVar42 = ZEXT416(auVar42._0_4_);
    fVar67 = (float)local_1e8._0_4_;
    auVar35 = local_268;
    auVar94 = local_278;
    auVar36 = _local_228;
    auVar46 = _local_248;
    auVar102 = _local_258;
    auVar41 = local_1b8;
    auVar37 = local_1c8;
    fVar51 = (float)local_1d8._0_4_;
    auVar99 = local_238;
  }
  else {
    auVar39 = vsqrtss_avx(auVar39,auVar39);
    fVar49 = auVar39._0_4_;
  }
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)((fVar67 / fVar49) * 0.0)),
                            ZEXT416((uint)(fVar51 / fVar49)),auVar44);
  auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)(fVar50 / fVar49)),auVar44);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * (fVar67 / fVar49))),auVar41,
                            ZEXT416((uint)(fVar51 / fVar49)));
  auVar37 = vfmadd213ss_fma(auVar42,ZEXT416((uint)(fVar50 / fVar49)),auVar37);
  auVar44 = vfmsub231ss_fma(ZEXT416((uint)(auVar33._0_4_ * auVar33._0_4_)),auVar43,auVar34);
  fVar50 = 1.0 / auVar44._0_4_;
  auVar44 = vfmsub231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar39._0_4_)),auVar37,auVar33);
  fVar51 = fVar50 * auVar44._0_4_;
  auVar44 = vfmsub231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar37._0_4_)),auVar39,auVar33);
  fVar67 = fVar50 * auVar44._0_4_;
  local_1f0 = local_2b8.super_Tuple3<pbrt::Vector3,_float>.z * fVar51 +
              local_2c8.super_Tuple3<pbrt::Vector3,_float>.z * fVar67;
  auVar59._0_4_ =
       local_2b8.super_Tuple3<pbrt::Vector3,_float>.x * fVar51 +
       local_2c8.super_Tuple3<pbrt::Vector3,_float>.x * fVar67;
  auVar59._4_4_ =
       local_2b8.super_Tuple3<pbrt::Vector3,_float>.y * fVar51 +
       local_2c8.super_Tuple3<pbrt::Vector3,_float>.y * fVar67;
  auVar59._8_4_ = fVar51 * 0.0 + fVar67 * 0.0;
  auVar59._12_4_ = fVar51 * 0.0 + fVar67 * 0.0;
  _va = vmovlps_avx(auVar59);
  auVar34 = vfmsub231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar37._0_4_)),auVar39,auVar33);
  fVar51 = fVar50 * auVar34._0_4_;
  auVar37 = vfmsub231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar39._0_4_)),auVar33,auVar37);
  fVar50 = fVar50 * auVar37._0_4_;
  local_f0.z = local_2b8.super_Tuple3<pbrt::Vector3,_float>.z * fVar51 +
               local_2c8.super_Tuple3<pbrt::Vector3,_float>.z * fVar50;
  auVar53._0_4_ =
       local_2b8.super_Tuple3<pbrt::Vector3,_float>.x * fVar51 +
       local_2c8.super_Tuple3<pbrt::Vector3,_float>.x * fVar50;
  auVar53._4_4_ =
       local_2b8.super_Tuple3<pbrt::Vector3,_float>.y * fVar51 +
       local_2c8.super_Tuple3<pbrt::Vector3,_float>.y * fVar50;
  auVar53._8_4_ = fVar51 * 0.0 + fVar50 * 0.0;
  auVar53._12_4_ = fVar51 * 0.0 + fVar50 * 0.0;
  local_f0._0_8_ = vmovlps_avx(auVar53);
  auVar54._8_4_ = 0x7fffffff;
  auVar54._0_8_ = 0x7fffffff7fffffff;
  auVar54._12_4_ = 0x7fffffff;
  auVar43 = vandps_avx512vl(auVar105,auVar54);
  auVar37 = vinsertps_avx512f(auVar99,auVar35,0x10);
  auVar37 = vandps_avx(auVar37,auVar54);
  auVar33 = vandps_avx512vl(auVar94,auVar54);
  auVar33 = vmaxps_avx(auVar33,auVar43);
  auVar43 = vinsertps_avx512f(auVar36,auVar32,0x10);
  auVar43 = vandps_avx(auVar43,auVar54);
  auVar37 = vmaxps_avx(auVar43,auVar37);
  auVar43 = vandps_avx512vl(auVar46,auVar54);
  auVar34 = vandps_avx512vl(auVar102,auVar54);
  auVar43 = vmaxps_avx(auVar34,auVar43);
  auVar43 = vmaxps_avx(auVar43,auVar33);
  auVar33 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar33,auVar37);
  auVar32._8_4_ = 0x34800002;
  auVar32._0_8_ = 0x3480000234800002;
  auVar32._12_4_ = 0x34800002;
  auVar43 = vmulps_avx512vl(auVar43,auVar32);
  local_100.z = auVar37._0_4_ * 2.3841864e-07;
  local_100._0_8_ = vmovlps_avx(auVar43);
  if (mesh->faceIndices == (int *)0x0) {
    iVar31 = 0;
  }
  else {
    iVar31 = mesh->faceIndices[patchIndex];
  }
  bVar28 = mesh->reverseOrientation;
  bVar20 = mesh->transformSwapsHandedness;
  Point3fi::Point3fi((Point3fi *)&vb,(Point3f *)&local_e0,(Vector3f *)&local_100);
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,(Point3fi *)&vb,&uvTex,(Vector3f *)local_208,&local_2b8,
             &local_2c8,(Normal3f *)&va,(Normal3f *)&local_f0,(Float)local_288._0_4_,
             bVar28 != bVar20);
  __return_storage_ptr__->faceIndex = iVar31;
  pNVar24 = mesh->n;
  if (pNVar24 != (Normal3f *)0x0) {
    fVar51 = pNVar24[piVar21[lVar30]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar67 = pNVar24[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar50 = pNVar24[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    uVar3 = pNVar24[piVar21[lVar30]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14 = pNVar24[piVar21[lVar30]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_208._4_4_ = uVar14;
    local_208._0_4_ = uVar3;
    uVar4 = pNVar24[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar15 = pNVar24[piVar21[lVar30 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_228._4_4_ = uVar15;
    local_228._0_4_ = uVar4;
    uVar5 = pNVar24[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16 = pNVar24[piVar21[lVar30 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_248._4_4_ = uVar16;
    local_248._0_4_ = uVar5;
    uVar6 = pNVar24[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar17 = pNVar24[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_258._4_4_ = uVar17;
    local_258._0_4_ = uVar6;
    fVar49 = pNVar24[piVar21[lVar30 + 3]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar25 = (uv->super_Tuple2<pbrt::Point2,_float>).y;
    fVar48 = 1.0 - fVar25;
    fVar73 = (uv->super_Tuple2<pbrt::Point2,_float>).x;
    fVar78 = 1.0 - fVar73;
    local_2a8.super_Tuple3<pbrt::Normal3,_float>.z =
         fVar78 * (fVar50 * fVar25 + fVar51 * fVar48) + fVar73 * (fVar49 * fVar25 + fVar67 * fVar48)
    ;
    auVar55._0_4_ =
         fVar78 * ((float)uVar5 * fVar25 + (float)uVar3 * fVar48) +
         fVar73 * ((float)uVar6 * fVar25 + (float)uVar4 * fVar48);
    auVar55._4_4_ =
         fVar78 * ((float)uVar16 * fVar25 + (float)uVar14 * fVar48) +
         fVar73 * ((float)uVar17 * fVar25 + (float)uVar15 * fVar48);
    auVar55._8_4_ = fVar78 * (fVar25 * 0.0 + fVar48 * 0.0) + fVar73 * (fVar25 * 0.0 + fVar48 * 0.0);
    auVar55._12_4_ = fVar78 * (fVar25 * 0.0 + fVar48 * 0.0) + fVar73 * (fVar25 * 0.0 + fVar48 * 0.0)
    ;
    uVar27 = vmovlps_avx(auVar55);
    local_2a8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar27;
    local_2a8.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar27 >> 0x20);
    auVar56._0_4_ = auVar55._0_4_ * auVar55._0_4_;
    auVar56._4_4_ = auVar55._4_4_ * auVar55._4_4_;
    auVar56._8_4_ = auVar55._8_4_ * auVar55._8_4_;
    auVar56._12_4_ = auVar55._12_4_ * auVar55._12_4_;
    auVar37 = vhaddps_avx(auVar56,auVar56);
    fVar25 = auVar37._0_4_ +
             local_2a8.super_Tuple3<pbrt::Normal3,_float>.z *
             local_2a8.super_Tuple3<pbrt::Normal3,_float>.z;
    if (0.0 < fVar25) {
      local_288._0_4_ = fVar51;
      uStack_200 = 0;
      _fStack_220 = 0;
      local_238._0_4_ = fVar67;
      _fStack_240 = 0;
      _fStack_250 = 0;
      local_268._0_4_ = fVar50;
      local_278._0_4_ = fVar49;
      if (fVar25 < 0.0) {
        fVar51 = sqrtf(fVar25);
      }
      else {
        auVar37 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
        fVar51 = auVar37._0_4_;
      }
      auVar60._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar60._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar60._8_8_ = 0;
      auVar70._4_4_ = fVar51;
      auVar70._0_4_ = fVar51;
      auVar70._8_4_ = fVar51;
      auVar70._12_4_ = fVar51;
      auVar37 = vdivps_avx(auVar60,auVar70);
      local_2a8.super_Tuple3<pbrt::Normal3,_float>.z =
           local_2a8.super_Tuple3<pbrt::Normal3,_float>.z / fVar51;
      uVar27 = vmovlps_avx(auVar37);
      local_2a8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar27;
      local_2a8.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar27 >> 0x20);
      fVar51 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar7 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar18 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar61._0_4_ = (float)uVar7 * (float)uVar7;
      auVar61._4_4_ = (float)uVar18 * (float)uVar18;
      auVar61._8_8_ = 0;
      auVar37 = vmovshdup_avx(auVar61);
      fVar51 = fVar51 * fVar51 + auVar61._0_4_ + auVar37._0_4_;
      if (fVar51 < 0.0) {
        fVar51 = sqrtf(fVar51);
      }
      else {
        auVar37 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
        fVar51 = auVar37._0_4_;
      }
      auVar33 = ZEXT416((uint)((__return_storage_ptr__->super_Interaction).n.
                               super_Tuple3<pbrt::Normal3,_float>.x / fVar51));
      uVar8 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar19 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar62._4_4_ = uVar19;
      auVar62._0_4_ = uVar8;
      auVar62._8_8_ = 0;
      auVar57._4_4_ = fVar51;
      auVar57._0_4_ = fVar51;
      auVar57._8_4_ = fVar51;
      auVar57._12_4_ = fVar51;
      auVar43 = vdivps_avx512vl(auVar62,auVar57);
      auVar63._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar63._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar63._8_8_ = 0;
      auVar37 = vpermt2ps_avx512vl(auVar43,_DAT_00462af0,auVar33);
      auVar80._0_4_ = auVar37._0_4_ * local_2a8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar80._4_4_ = auVar37._4_4_ * local_2a8.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar80._8_4_ = auVar37._8_4_ * 0.0;
      auVar80._12_4_ = auVar37._12_4_ * 0.0;
      auVar34 = vpermi2ps_avx512vl(_DAT_00462af0,auVar63,
                                   ZEXT416((uint)local_2a8.super_Tuple3<pbrt::Normal3,_float>.x));
      auVar34 = vfmsub213ps_avx512vl(auVar34,auVar43,auVar80);
      auVar37 = vfnmadd213ps_fma(auVar37,auVar63,auVar80);
      auVar71._0_4_ = auVar34._0_4_ + auVar37._0_4_;
      auVar71._4_4_ = auVar34._4_4_ + auVar37._4_4_;
      auVar71._8_4_ = auVar34._8_4_ + auVar37._8_4_;
      auVar71._12_4_ = auVar34._12_4_ + auVar37._12_4_;
      auVar34 = vmulss_avx512f(auVar43,ZEXT416((uint)local_2a8.super_Tuple3<pbrt::Normal3,_float>.x)
                              );
      auVar37 = vfmsub213ss_fma(auVar63,auVar33,auVar34);
      auVar34 = vfnmadd213ss_avx512f
                          (ZEXT416((uint)local_2a8.super_Tuple3<pbrt::Normal3,_float>.x),auVar43,
                           auVar34);
      local_298.z = auVar37._0_4_ + auVar34._0_4_;
      uVar13 = vmovlps_avx(auVar71);
      local_298.x = (float)uVar13;
      local_298.y = (float)(uVar13 >> 0x20);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(local_298.y * local_298.y)),
                                ZEXT416((uint)local_298.x),ZEXT416((uint)local_298.x));
      auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_298.z),ZEXT416((uint)local_298.z));
      fVar51 = auVar37._0_4_;
      if (1e-14 < fVar51) {
        fVar67 = (uv->super_Tuple2<pbrt::Point2,_float>).y;
        fVar50 = 1.0 - fVar67;
        local_110.z = ((float)local_278._0_4_ * fVar67 + (float)local_238._0_4_ * fVar50) -
                      ((float)local_268._0_4_ * fVar67 + (float)local_288._0_4_ * fVar50);
        auVar81._0_4_ = (float)local_258._0_4_ * fVar67 + (float)local_228._0_4_ * fVar50;
        auVar81._4_4_ = (float)local_258._4_4_ * fVar67 + (float)local_228._4_4_ * fVar50;
        auVar81._8_4_ = fStack_250 * fVar67 + fStack_220 * fVar50;
        auVar81._12_4_ = fStack_24c * fVar67 + fStack_21c * fVar50;
        auVar64._0_4_ = (float)local_248._0_4_ * fVar67 + (float)local_208._0_4_ * fVar50;
        auVar64._4_4_ = (float)local_248._4_4_ * fVar67 + (float)local_208._4_4_ * fVar50;
        auVar64._8_4_ = fStack_240 * fVar67 + (float)uStack_200 * fVar50;
        auVar64._12_4_ = fStack_23c * fVar67 + uStack_200._4_4_ * fVar50;
        auVar34 = vsubps_avx(auVar81,auVar64);
        local_110._0_8_ = vmovlps_avx(auVar34);
        fVar67 = (uv->super_Tuple2<pbrt::Point2,_float>).x;
        fVar50 = 1.0 - fVar67;
        local_120.z = ((float)local_278._0_4_ * fVar67 + (float)local_268._0_4_ * fVar50) -
                      ((float)local_238._0_4_ * fVar67 + (float)local_288._0_4_ * fVar50);
        auVar82._0_4_ = (float)local_258._0_4_ * fVar67 + (float)local_248._0_4_ * fVar50;
        auVar82._4_4_ = (float)local_258._4_4_ * fVar67 + (float)local_248._4_4_ * fVar50;
        auVar82._8_4_ = fStack_250 * fVar67 + fStack_240 * fVar50;
        auVar82._12_4_ = fStack_24c * fVar67 + fStack_23c * fVar50;
        auVar65._0_4_ = (float)local_228._0_4_ * fVar67 + (float)local_208._0_4_ * fVar50;
        auVar65._4_4_ = (float)local_228._4_4_ * fVar67 + (float)local_208._4_4_ * fVar50;
        auVar65._8_4_ = fStack_220 * fVar67 + (float)uStack_200 * fVar50;
        auVar65._12_4_ = fStack_21c * fVar67 + uStack_200._4_4_ * fVar50;
        auVar34 = vsubps_avx(auVar82,auVar65);
        local_120._0_8_ = vmovlps_avx(auVar34);
        auVar34 = ZEXT416(0) << 0x20;
        if (fVar51 < 0.0) {
          local_298._0_8_ = uVar13;
          local_288 = auVar33;
          _local_208 = auVar43;
          fVar51 = sqrtf(fVar51);
          auVar34 = ZEXT816(0) << 0x40;
          auVar43 = _local_208;
          auVar33 = local_288;
        }
        else {
          auVar37 = vsqrtss_avx(auVar37,auVar37);
          fVar51 = auVar37._0_4_;
          local_298._0_8_ = uVar13;
        }
        auVar66._8_8_ = 0;
        auVar66._0_4_ = local_298.x;
        auVar66._4_4_ = local_298.y;
        auVar72._4_4_ = fVar51;
        auVar72._0_4_ = fVar51;
        auVar72._8_4_ = fVar51;
        auVar72._12_4_ = fVar51;
        auVar37 = vdivps_avx(auVar66,auVar72);
        local_298.z = local_298.z / fVar51;
        local_298._0_8_ = vmovlps_avx(auVar37);
        auVar58._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar58._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y;
        auVar58._8_8_ = 0;
        auVar37 = vmulps_avx512vl(auVar43,auVar58);
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar35 = vxorps_avx512vl(auVar37,auVar29);
        auVar37 = vpermi2ps_avx512vl(_DAT_00462ba0,auVar37,auVar35);
        auVar37 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar58);
        auVar37 = vhaddps_avx(auVar37,auVar37);
        auVar43 = vfmadd231ss_fma(auVar37,auVar33,
                                  ZEXT416((uint)local_2a8.super_Tuple3<pbrt::Normal3,_float>.x));
        auVar37 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar43,auVar43);
        auVar37 = vmaxss_avx(auVar37,auVar34);
        if (auVar37._0_4_ < 0.0) {
          local_288 = auVar43;
          sinTheta = sqrtf(auVar37._0_4_);
          auVar43 = local_288;
        }
        else {
          auVar37 = vsqrtss_avx(auVar37,auVar37);
          sinTheta = auVar37._0_4_;
        }
        Rotate((Transform *)&vb,sinTheta,auVar43._0_4_,(Vector3f *)&local_298);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                vb._4_4_)),ZEXT416(vb._0_4_),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar33 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_a8),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(local_9c *
                                                local_2b8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_a0),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_98),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_8c *
                                                local_2b8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_90),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar34 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_88),
                                  ZEXT416((uint)local_2b8.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar37 = vinsertps_avx(auVar33,auVar37,0x10);
        vmovlps_avx(auVar37);
        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_2c8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                vb._4_4_)),
                                  ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416(vb._0_4_));
        auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>
                                                        .z),ZEXT416((uint)local_a8));
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_9c *
                                                local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)local_a0));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>
                                                        .z),ZEXT416((uint)local_98));
        auVar43 = vinsertps_avx(auVar43,auVar35,0x10);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_8c *
                                                local_2c8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_90),
                                  ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)local_88),
                                  ZEXT416((uint)local_2c8.super_Tuple3<pbrt::Vector3,_float>.z));
        local_d0._0_8_ = vmovlps_avx(auVar43);
        local_d0.z = auVar35._0_4_;
        auVar76._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y;
        auVar76._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.x;
        auVar76._8_8_ = 0;
        auVar83._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.x * auVar37._0_4_;
        auVar83._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y * auVar37._4_4_;
        auVar83._8_4_ = auVar37._8_4_ * 0.0;
        auVar83._12_4_ = auVar37._12_4_ * 0.0;
        auVar43 = vmovshdup_avx(auVar83);
        auVar43 = vfmadd231ss_fma(auVar43,auVar76,auVar33);
        auVar43 = vfmadd231ss_fma(auVar43,auVar34,
                                  ZEXT416((uint)local_2a8.super_Tuple3<pbrt::Normal3,_float>.z));
        fVar51 = auVar43._0_4_;
        auVar77._0_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.x * fVar51;
        auVar77._4_4_ = local_2a8.super_Tuple3<pbrt::Normal3,_float>.y * fVar51;
        auVar77._8_4_ = fVar51 * 0.0;
        auVar77._12_4_ = fVar51 * 0.0;
        auVar37 = vsubps_avx(auVar37,auVar77);
        local_c0.z = auVar34._0_4_ - local_2a8.super_Tuple3<pbrt::Normal3,_float>.z * fVar51;
        local_c0._0_8_ = vmovlps_avx(auVar37);
        SurfaceInteraction::SetShadingGeometry
                  (__return_storage_ptr__,&local_2a8,(Vector3f *)&local_c0,(Vector3f *)&local_d0,
                   (Normal3f *)&local_110,(Normal3f *)&local_120,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex,
                                                          const Point2f &uv, Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }